

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QCheckPoint>::emplace<QCheckPoint_const&>
          (QPodArrayOps<QCheckPoint> *this,qsizetype i,QCheckPoint *args)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  qsizetype qVar6;
  QCheckPoint *pQVar7;
  undefined8 *in_RDX;
  QArrayDataPointer<QCheckPoint> *in_RSI;
  QArrayDataPointer<QCheckPoint> *in_RDI;
  long in_FS_OFFSET;
  QCheckPoint *where;
  GrowthPosition pos;
  bool detach;
  QCheckPoint tmp;
  QArrayDataPointer<QCheckPoint> *in_stack_ffffffffffffffb8;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = QArrayDataPointer<QCheckPoint>::needsDetach(in_RDI);
  uVar9 = CONCAT13(bVar5,(int3)in_stack_ffffffffffffffc4);
  if (!bVar5) {
    if ((in_RSI == (QArrayDataPointer<QCheckPoint> *)in_RDI->size) &&
       (qVar6 = QArrayDataPointer<QCheckPoint>::freeSpaceAtEnd(in_stack_ffffffffffffffb8),
       qVar6 != 0)) {
      pQVar7 = QArrayDataPointer<QCheckPoint>::end(in_RDI);
      uVar2 = *in_RDX;
      pQVar7->y = (QFixed)(int)uVar2;
      pQVar7->frameY = (QFixed)(int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[1];
      pQVar7->positionInFrame = (int)uVar2;
      pQVar7->minimumWidth = (QFixed)(int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[2];
      pQVar7->maximumWidth = (QFixed)(int)uVar2;
      pQVar7->contentsWidth = (QFixed)(int)((ulong)uVar2 >> 0x20);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0081f7a6;
    }
    if ((in_RSI == (QArrayDataPointer<QCheckPoint> *)0x0) &&
       (qVar6 = QArrayDataPointer<QCheckPoint>::freeSpaceAtBegin(in_stack_ffffffffffffffb8),
       qVar6 != 0)) {
      pQVar7 = QArrayDataPointer<QCheckPoint>::begin((QArrayDataPointer<QCheckPoint> *)0x81f6a5);
      uVar2 = *in_RDX;
      pQVar7[-1].y = (QFixed)(int)uVar2;
      pQVar7[-1].frameY = (QFixed)(int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[1];
      pQVar7[-1].positionInFrame = (int)uVar2;
      pQVar7[-1].minimumWidth = (QFixed)(int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[2];
      pQVar7[-1].maximumWidth = (QFixed)(int)uVar2;
      pQVar7[-1].contentsWidth = (QFixed)(int)((ulong)uVar2 >> 0x20);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0081f7a6;
    }
  }
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  uVar4 = in_RDX[2];
  uVar8 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<QCheckPoint> *)0x0)) {
    uVar8 = 1;
  }
  QArrayDataPointer<QCheckPoint>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar9,uVar8),
             (QCheckPoint **)in_stack_ffffffffffffffb8,in_RDI);
  pQVar7 = createHole((QPodArrayOps<QCheckPoint> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT44(uVar9,uVar8),(qsizetype)in_stack_ffffffffffffffb8);
  pQVar7->y = (QFixed)(int)uVar2;
  pQVar7->frameY = (QFixed)(int)((ulong)uVar2 >> 0x20);
  pQVar7->positionInFrame = (int)uVar3;
  pQVar7->minimumWidth = (QFixed)(int)((ulong)uVar3 >> 0x20);
  pQVar7->maximumWidth = (QFixed)(int)uVar4;
  pQVar7->contentsWidth = (QFixed)(int)((ulong)uVar4 >> 0x20);
LAB_0081f7a6:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }